

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t spvtools::val::ValidateExtension(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  spv_parsed_instruction_t *this;
  char *pcVar3;
  DiagnosticStream *pDVar4;
  spv_parsed_instruction_t *inst_00;
  DiagnosticStream local_218;
  undefined1 local_40 [8];
  string extension;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  extension.field_2._8_8_ = inst;
  uVar2 = ValidationState_t::version(_);
  if (0x103ff < uVar2) {
    return SPV_SUCCESS;
  }
  this = Instruction::c_inst((Instruction *)extension.field_2._8_8_);
  GetExtensionString_abi_cxx11_((string *)local_40,(spvtools *)this,inst_00);
  pcVar3 = ExtensionToString(kSPV_KHR_workgroup_memory_explicit_layout);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,pcVar3);
  if (!bVar1) {
    pcVar3 = ExtensionToString(kSPV_EXT_mesh_shader);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,pcVar3);
    if (!bVar1) {
      pcVar3 = ExtensionToString(kSPV_NV_shader_invocation_reorder);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,pcVar3);
      if (!bVar1) {
        pcVar3 = ExtensionToString(kSPV_NV_cluster_acceleration_structure);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,pcVar3);
        if (!bVar1) {
          pcVar3 = ExtensionToString(kSPV_NV_linear_swept_spheres);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,pcVar3);
          if (!bVar1) {
            bVar1 = false;
            goto LAB_00b77295;
          }
        }
      }
    }
  }
  ValidationState_t::diag
            (&local_218,_,SPV_ERROR_WRONG_VERSION,(Instruction *)extension.field_2._8_8_);
  pDVar4 = DiagnosticStream::operator<<
                     (&local_218,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40)
  ;
  pDVar4 = DiagnosticStream::operator<<
                     (pDVar4,(char (*) [49])" extension requires SPIR-V version 1.4 or later.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
  DiagnosticStream::~DiagnosticStream(&local_218);
  bVar1 = true;
LAB_00b77295:
  std::__cxx11::string::~string((string *)local_40);
  if (!bVar1) {
    return SPV_SUCCESS;
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateExtension(ValidationState_t& _, const Instruction* inst) {
  if (_.version() < SPV_SPIRV_VERSION_WORD(1, 4)) {
    std::string extension = GetExtensionString(&(inst->c_inst()));
    if (extension ==
            ExtensionToString(kSPV_KHR_workgroup_memory_explicit_layout) ||
        extension == ExtensionToString(kSPV_EXT_mesh_shader) ||
        extension == ExtensionToString(kSPV_NV_shader_invocation_reorder) ||
        extension ==
            ExtensionToString(kSPV_NV_cluster_acceleration_structure) ||
        extension == ExtensionToString(kSPV_NV_linear_swept_spheres)) {
      return _.diag(SPV_ERROR_WRONG_VERSION, inst)
             << extension << " extension requires SPIR-V version 1.4 or later.";
    }
  }

  return SPV_SUCCESS;
}